

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okiadpcm.c
# Opt level: O0

INT16 oki_adpcm_clock(oki_adpcm_state *adpcm,UINT8 nibble)

{
  UINT8 nibble_local;
  oki_adpcm_state *adpcm_local;
  
  adpcm->signal = adpcm->signal + adpcm->diff_lookup[(int)(adpcm->step * 0x10 + (nibble & 0xf))];
  if (adpcm->signal < 0x800) {
    if (adpcm->signal < -0x800) {
      adpcm->signal = -0x800;
    }
  }
  else {
    adpcm->signal = 0x7ff;
  }
  adpcm->step = adpcm->step + (short)adpcm->index_shift[(int)(nibble & 7)];
  if (adpcm->step < 0x31) {
    if (adpcm->step < 0) {
      adpcm->step = 0;
    }
  }
  else {
    adpcm->step = 0x30;
  }
  return adpcm->signal;
}

Assistant:

INT16 oki_adpcm_clock(oki_adpcm_state* adpcm, UINT8 nibble)
{
	// update the signal
	adpcm->signal += adpcm->diff_lookup[adpcm->step * 16 + (nibble & 15)];

	// clamp to the maximum
	if (adpcm->signal > 2047)
		adpcm->signal = 2047;
	else if (adpcm->signal < -2048)
		adpcm->signal = -2048;

	// adjust the step size and clamp
	adpcm->step += adpcm->index_shift[nibble & 7];
	if (adpcm->step > 48)
		adpcm->step = 48;
	else if (adpcm->step < 0)
		adpcm->step = 0;

	// return the signal
	return adpcm->signal;
}